

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

shared_ptr<chatra::Node> chatra::parseAsLiteral(ParserContext *ct,Token *token)

{
  string *str;
  char *pcVar1;
  TokenType TVar2;
  StringId SVar3;
  pointer pcVar4;
  iterator __position;
  undefined1 __nptr [8];
  bool bVar5;
  pointer __p;
  long lVar6;
  ulong uVar7;
  int *piVar8;
  long *plVar9;
  uint64_t uVar10;
  IErrorReceiver *pIVar11;
  undefined8 *puVar12;
  long *plVar13;
  pointer pbVar14;
  Token *in_RDX;
  short *extraout_RDX;
  short *extraout_RDX_00;
  short *index;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_01;
  size_t in_R8;
  shared_ptr<chatra::Node> sVar15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  pointer local_100;
  size_type __dnew;
  pointer *local_e8;
  pointer local_e0;
  pointer local_d8 [3];
  double local_c0;
  Token *local_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  int local_8c;
  undefined1 auStack_88 [8];
  size_type __dnew_1;
  undefined8 local_78;
  undefined8 uStack_70;
  allocator_type local_61;
  undefined1 local_60 [8];
  string targetStr;
  unique_ptr<chatra::Literal,_std::default_delete<chatra::Literal>_> value;
  
  str = &in_RDX->literal;
  __p = (pointer)operator_new(0x30);
  (__p->vString)._M_dataplus._M_p = (pointer)0x0;
  (__p->vString)._M_string_length = 0;
  (__p->vString).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__p->vString).field_2 + 8) = 0;
  *(undefined8 *)__p = 0;
  (__p->field_1).vInt = 0;
  (__p->vString)._M_dataplus._M_p = (pointer)&(__p->vString).field_2;
  (__p->vString)._M_string_length = 0;
  (__p->vString).field_2._M_local_buf[0] = '\0';
  TVar2 = in_RDX->type;
  if (TVar2 == String) {
    __p->type = String;
    uVar7 = (in_RDX->literal)._M_string_length;
    index = extraout_RDX;
    if ((uVar7 == 0) ||
       ((*(str->_M_dataplus)._M_p != '\'' &&
        (index = (short *)(str->_M_dataplus)._M_p, (char)*index != '\"')))) {
      if (((uVar7 < 2) || (index = (short *)(str->_M_dataplus)._M_p, *index != 0x274c)) &&
         ((uVar7 < 2 || (index = (short *)(str->_M_dataplus)._M_p, *index != 0x224c)))) {
        if (((1 < uVar7) && (*(short *)(str->_M_dataplus)._M_p == 0x2772)) ||
           (bVar5 = startsWith(str,0,"r\""), index = extraout_RDX_00, bVar5)) {
          parseRegexpStringLiteral((string *)local_60,str,(size_t)index);
        }
        else {
          bVar5 = startsWith(str,0,"R<<<\n");
          if (!bVar5) goto LAB_0019fe28;
          parseRawStringLiteral((string *)local_60,(ParserContext *)token,in_RDX,str,in_R8);
        }
      }
      else {
        __p->type = MultilingualString;
        parseStringLiteral((string *)local_60,(ParserContext *)token,in_RDX,str,1);
      }
    }
    else {
      parseStringLiteral((string *)local_60,(ParserContext *)token,in_RDX,str,0);
    }
    std::__cxx11::string::operator=((string *)&__p->vString,(string *)local_60);
    if (local_60 != (undefined1  [8])&targetStr._M_string_length) {
      operator_delete((void *)local_60);
    }
  }
  else if (TVar2 == Name) {
    SVar3 = in_RDX->sid;
    if (SVar3 == Null) {
      __p->type = Null;
    }
    else {
      __p->type = Bool;
      if (1 < SVar3 - True) {
        auStack_88 = (undefined1  [8])0x18;
        local_60 = (undefined1  [8])&targetStr._M_string_length;
        local_60 = (undefined1  [8])
                   std::__cxx11::string::_M_create((ulong *)local_60,(ulong)auStack_88);
        targetStr._M_string_length = (size_type)auStack_88;
        *(undefined8 *)local_60 = 0x2064696c61766e69;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)((long)local_60 + 8))->_M_allocated_capacity = 0x206e61656c6f6f62;
        pcVar1 = (char *)((long)local_60 + 0x10);
        pcVar1[0] = 'c';
        pcVar1[1] = 'o';
        pcVar1[2] = 'n';
        pcVar1[3] = 's';
        pcVar1[4] = 't';
        pcVar1[5] = 'a';
        pcVar1[6] = 'n';
        pcVar1[7] = 't';
        targetStr._M_dataplus._M_p = (pointer)auStack_88;
        *(char *)((long)local_60 + (long)auStack_88) = '\0';
        auStack_88 = (undefined1  [8])0x0;
        __dnew_1 = 0;
        local_78 = (pointer)0x0;
        ParserContext::errorAtToken
                  ((ParserContext *)token,Error,in_RDX,(string *)local_60,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)auStack_88);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_88);
        if (local_60 != (undefined1  [8])&targetStr._M_string_length) {
          operator_delete((void *)local_60);
        }
      }
      (__p->field_1).vBool = SVar3 == True;
    }
  }
  else {
    if (TVar2 != Number) {
      local_60 = (undefined1  [8])&targetStr._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"internal error","");
      auStack_88 = (undefined1  [8])0x0;
      __dnew_1 = 0;
      local_78 = (pointer)0x0;
      ParserContext::errorAtToken
                ((ParserContext *)token,Error,in_RDX,(string *)local_60,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)auStack_88);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_88);
      if (local_60 != (undefined1  [8])&targetStr._M_string_length) {
        operator_delete((void *)local_60);
      }
      puVar12 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar12 = &PTR__exception_002461d8;
      __cxa_throw(puVar12,&AbortCompilingException::typeinfo,std::exception::~exception);
    }
    uVar7 = (in_RDX->literal)._M_string_length;
    if ((uVar7 < 2) || (*(short *)(str->_M_dataplus)._M_p != 0x7830)) {
      if ((uVar7 < 2) || (*(short *)(str->_M_dataplus)._M_p != 0x6230)) {
        lVar6 = std::__cxx11::string::find((char)str,0x2e);
        if (lVar6 != -1) {
          __p->type = Float;
          local_60 = (undefined1  [8])&targetStr._M_string_length;
          pcVar4 = (in_RDX->literal)._M_dataplus._M_p;
          local_b8 = token;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_60,pcVar4,pcVar4 + (in_RDX->literal)._M_string_length);
          while (uVar7 = std::__cxx11::string::find((char)local_60,0x5f), __nptr = local_60,
                uVar7 != 0xffffffffffffffff) {
            std::__cxx11::string::erase((ulong)local_60,uVar7);
          }
          piVar8 = __errno_location();
          local_8c = *piVar8;
          *piVar8 = 0;
          local_c0 = strtod((char *)__nptr,(char **)auStack_88);
          if (auStack_88 == __nptr) {
            std::__throw_invalid_argument("stod");
          }
          else if (*piVar8 != 0x22) {
            if (*piVar8 == 0) {
              *piVar8 = local_8c;
            }
            if ((pointer)((long)auStack_88 + -(long)__nptr) < targetStr._M_dataplus._M_p) {
              local_100 = (pointer)0x16;
              local_e8 = local_d8;
              local_e8 = (pointer *)
                         std::__cxx11::string::_M_create
                                   ((ulong *)&local_e8,(ulong)&stack0xffffffffffffff00);
              local_d8[0] = local_100;
              *local_e8 = (pointer)0x2064696c61766e69;
              local_e8[1] = (pointer)0x7b24207469676964;
              builtin_strncpy((char *)((long)local_e8 + 0xe),"${0} in ",8);
              local_e0 = local_100;
              *(char *)((long)local_e8 + (long)local_100) = '\0';
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
              local_b0 = &local_a0;
              plVar13 = plVar9 + 2;
              if ((long *)*plVar9 == plVar13) {
                local_a0 = *plVar13;
                lStack_98 = plVar9[3];
              }
              else {
                local_a0 = *plVar13;
                local_b0 = (long *)*plVar9;
              }
              local_a8 = plVar9[1];
              *plVar9 = (long)plVar13;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              plVar9 = (long *)std::__cxx11::string::append((char *)&local_b0);
              pbVar14 = (pointer)(plVar9 + 2);
              if ((pointer)*plVar9 == pbVar14) {
                local_78 = (pbVar14->_M_dataplus)._M_p;
                uStack_70 = plVar9[3];
                auStack_88 = (undefined1  [8])&stack0xffffffffffffff88;
              }
              else {
                local_78 = (pbVar14->_M_dataplus)._M_p;
                auStack_88 = (undefined1  [8])*plVar9;
              }
              __dnew_1 = plVar9[1];
              *plVar9 = (long)pbVar14;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::__cxx11::string::substr((ulong)&local_128,(ulong)local_60);
              __l._M_len = 1;
              __l._M_array = &local_128;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&stack0xffffffffffffff00,__l,&local_61);
              ParserContext::errorAtToken
                        ((ParserContext *)local_b8,Error,in_RDX,(string *)auStack_88,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&stack0xffffffffffffff00);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&stack0xffffffffffffff00);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p);
              }
              if (auStack_88 != (undefined1  [8])&stack0xffffffffffffff88) {
                operator_delete((void *)auStack_88);
              }
              if (local_b0 != &local_a0) {
                operator_delete(local_b0);
              }
              if (local_e8 != local_d8) {
                operator_delete(local_e8);
              }
              local_c0 = 0.0;
            }
            if (local_60 != (undefined1  [8])&targetStr._M_string_length) {
              operator_delete((void *)local_60);
            }
            (__p->field_1).vFloat = local_c0;
            goto LAB_0019fe28;
          }
          std::__throw_out_of_range("stod");
        }
        __p->type = Int;
        uVar10 = parseIntLiteral((ParserContext *)token,in_RDX,str,0,"decimal",10);
      }
      else {
        __p->type = Int;
        uVar10 = parseIntLiteral((ParserContext *)token,in_RDX,str,2,"binary",2);
      }
    }
    else {
      __p->type = Int;
      uVar10 = parseIntLiteral((ParserContext *)token,in_RDX,str,2,"hexadecimal",0x10);
    }
    (__p->field_1).vInt = uVar10;
  }
LAB_0019fe28:
  ct->ws = (ParserWorkingSet *)0x0;
  pIVar11 = (IErrorReceiver *)operator_new(0xd0);
  pIVar11[1]._vptr_IErrorReceiver = (_func_int **)0x100000001;
  pIVar11->_vptr_IErrorReceiver = (_func_int **)&PTR___Sp_counted_ptr_inplace_00246ba8;
  memset(pIVar11 + 2,0,0xc0);
  *(undefined4 *)((long)&pIVar11[8]._vptr_IErrorReceiver + 4) = 0xffffffff;
  pIVar11[9]._vptr_IErrorReceiver = (_func_int **)0x0;
  *(undefined1 *)&pIVar11[10]._vptr_IErrorReceiver = 0xff;
  *(undefined8 *)((long)&pIVar11[10]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar11[0xb]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar11[0xc]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar11[0xd]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar11[0xe]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar11[0xf]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar11[0x10]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar11[0x11]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar11[0x12]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar11[0x13]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar11[0x14]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar11[0x15]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar11[0x16]._vptr_IErrorReceiver + 4) = 0;
  *(undefined8 *)((long)&pIVar11[0x17]._vptr_IErrorReceiver + 4) = 0;
  pIVar11[0x18]._vptr_IErrorReceiver = (_func_int **)0x0;
  pIVar11[0x19]._vptr_IErrorReceiver = (_func_int **)0x0;
  ct->errorReceiver = pIVar11;
  ct->ws = (ParserWorkingSet *)(pIVar11 + 2);
  *(undefined1 *)&pIVar11[2]._vptr_IErrorReceiver = 0x1a;
  __position._M_current = (Token **)pIVar11[6]._vptr_IErrorReceiver;
  if (__position._M_current == (Token **)pIVar11[7]._vptr_IErrorReceiver) {
    std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>::
    _M_realloc_insert<chatra::Token_const*>
              ((vector<chatra::Token_const*,std::allocator<chatra::Token_const*>> *)(pIVar11 + 5),
               __position,(Token **)local_60);
  }
  else {
    *__position._M_current = in_RDX;
    pIVar11[6]._vptr_IErrorReceiver = pIVar11[6]._vptr_IErrorReceiver + 1;
  }
  std::__uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_>::reset
            ((__uniq_ptr_impl<chatra::Literal,_std::default_delete<chatra::Literal>_> *)
             (pIVar11 + 9),__p);
  sVar15.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX_01._M_pi;
  sVar15.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)ct;
  return (shared_ptr<chatra::Node>)
         sVar15.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Node> parseAsLiteral(ParserContext& ct, const Token& token) {
	auto& t = token.literal;

	std::unique_ptr<Literal> value(new Literal());

	if (token.type == TokenType::Number) {
		if (startsWith(t, 0, "0x")) {
			value->type = LiteralType::Int;
			value->vInt = parseIntLiteral(ct, token, t, 2, "hexadecimal", 16);
		}
		else if (startsWith(t, 0, "0b")) {
			value->type = LiteralType::Int;
			value->vInt = parseIntLiteral(ct, token, t, 2, "binary", 2);
		}
		else if (t.find('.') != std::string::npos) {
			value->type = LiteralType::Float;
			value->vFloat = parseFloatLiteral(ct, token, t, 0);
		}
		else {
			value->type = LiteralType::Int;
			value->vInt = parseIntLiteral(ct, token, t, 0, "decimal", 10);
		}
	}
	else if (token.type == TokenType::Name) {
		if (token.sid == StringId::Null)
			value->type = LiteralType::Null;
		else {
			value->type = LiteralType::Bool;
			value->vBool = parseBooleanLiteral(ct, token, token.sid);
		}
	}
	else if (token.type == TokenType::String) {
		value->type = LiteralType::String;
		if (startsWith(t, 0, "'") || startsWith(t, 0, "\""))
			 value->vString = parseStringLiteral(ct, token, t, 0);
		else if (startsWith(t, 0, "L'") || startsWith(t, 0, "L\"")) {
			value->type = LiteralType ::MultilingualString;
			value->vString = parseStringLiteral(ct, token, t, 1);
		}
		else if (startsWith(t, 0, "r'") || startsWith(t, 0, "r\""))
			value->vString = parseRegexpStringLiteral(t, 1);
		else if (startsWith(t, 0, "R<<<\n"))
			value->vString = parseRawStringLiteral(ct, token, t, 5);
	}
	else {
		ct.errorAtToken(ErrorLevel::Error, token, "internal error", {});
		throw AbortCompilingException();
	}

	std::shared_ptr<Node> n = std::make_shared<Node>();
	n->type = NodeType::Literal;
	n->tokens.push_back(&token);
	n->literalValue = std::move(value);
	return n;
}